

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O2

bool Hex::Hexdumper<unsigned_int>::data_is_equal<std::pair<unsigned_int_const*,unsigned_int_const*>>
               (pair<const_unsigned_int_*,_const_unsigned_int_*> *a,
               pair<const_unsigned_int_*,_const_unsigned_int_*> *b)

{
  uint *__first1;
  uint *puVar1;
  uint *__first2;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  
  __first1 = a->first;
  puVar1 = a->second;
  __first2 = b->first;
  bVar2 = true;
  if (puVar1 != b->second || __first1 != __first2) {
    uVar4 = (long)b->second - (long)__first2;
    if ((long)puVar1 - (long)__first1 == uVar4) {
      if ((long)puVar1 - (long)__first1 != 0) {
        iVar3 = std::__memcmp<unsigned_int,unsigned_int>
                          (__first1,__first2,(long)puVar1 - (long)__first1 >> 2);
        uVar4 = (ulong)(iVar3 == 0);
      }
      return (bool)(puVar1 == __first1 | (byte)uVar4 & 1);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool data_is_equal(const PAIR& a, const PAIR& b)
    {
        if (a==b)
            return true;
        if (a.second-a.first != b.second-b.first)
            return false;
        return std::equal(a.first, a.second, b.first);
    }